

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void __thiscall mjs::object_literal_expression::print(object_literal_expression *this,wostream *os)

{
  long *plVar1;
  pointer ppVar2;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar3;
  wostream *pwVar4;
  pointer ppVar5;
  long lVar6;
  ulong uVar7;
  
  std::operator<<(os,"object_literal_expression{");
  ppVar2 = (this->elements_).
           super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->elements_).
      super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      ppVar5 = ppVar2;
      if (uVar7 != 0) {
        std::operator<<(os,", ");
        ppVar2 = (this->elements_).
                 super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar5 = (pointer)((long)&ppVar2->type_ + lVar6);
      }
      if (ppVar5->type_ != normal) {
        pbVar3 = mjs::operator<<(os,*(property_assignment_type *)((long)&ppVar2->type_ + lVar6));
        std::operator<<(pbVar3," ");
        ppVar2 = (this->elements_).
                 super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      plVar1 = *(long **)((long)&(ppVar2->name_)._M_t.
                                 super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                                 .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl +
                         lVar6);
      (**(code **)(*plVar1 + 0x10))(plVar1,os);
      pwVar4 = std::operator<<(os,": ");
      plVar1 = *(long **)((long)&(((this->elements_).
                                   super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->value_)._M_t.
                                 super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                         + lVar6);
      (**(code **)(*plVar1 + 0x10))(plVar1,pwVar4);
      uVar7 = uVar7 + 1;
      ppVar2 = (this->elements_).
               super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x18;
    } while (uVar7 < (ulong)(((long)(this->elements_).
                                    super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 3)
                            * -0x5555555555555555));
  }
  std::operator<<(os,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "object_literal_expression{";
        for (size_t i = 0; i < elements_.size(); ++i) {
            if (i) os << ", ";
            if (elements_[i].type() != property_assignment_type::normal) os << elements_[i].type() << " ";
            os << elements_[i].name() << ": " << elements_[i].value();
        }
        os << "}";
    }